

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

fixed_measurement __thiscall units::root(units *this,fixed_measurement *fm,int power)

{
  double dVar1;
  double extraout_XMM0_Qa;
  fixed_measurement fVar2;
  unit local_2c;
  unit local_24;
  int local_1c;
  fixed_measurement *pfStack_18;
  int power_local;
  fixed_measurement *fm_local;
  
  local_1c = power;
  pfStack_18 = fm;
  fm_local = (fixed_measurement *)this;
  dVar1 = fixed_measurement::value(fm);
  dVar1 = numericalRoot<double>(dVar1,local_1c);
  local_2c = fixed_measurement::units(pfStack_18);
  local_24 = root(&local_2c,local_1c);
  fixed_measurement::fixed_measurement((fixed_measurement *)this,dVar1,&local_24);
  fVar2.units_ = (unit)this;
  fVar2.value_ = extraout_XMM0_Qa;
  return fVar2;
}

Assistant:

fixed_measurement root(const fixed_measurement& fm, int power)
{
    return {numericalRoot(fm.value(), power), root(fm.units(), power)};
}